

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_msgpack.hpp
# Opt level: O0

type jsoncons::msgpack::
     decode_msgpack<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (istream *is,msgpack_decode_options *options)

{
  error_code ec;
  bool bVar1;
  undefined8 uVar2;
  msgpack_decode_options *options_00;
  msgpack_decode_options *in_RDX;
  void *__buf;
  undefined8 extraout_RDX;
  int __fd;
  error_code *in_RSI;
  basic_msgpack_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *in_RDI;
  type tVar3;
  msgpack_stream_reader reader;
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
  adaptor;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  decoder;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_fffffffffffffbe8;
  basic_msgpack_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffbf8;
  conv_errc __e;
  json_visitor *visitor;
  basic_msgpack_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this;
  allocator<char> *paVar4;
  error_category *peVar5;
  temp_allocator_type *in_stack_fffffffffffffc40;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_fffffffffffffc48;
  ser_context in_stack_fffffffffffffc50;
  error_category local_9a;
  allocator<char> local_99;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  local_98;
  msgpack_decode_options *local_18;
  error_code *local_10;
  
  __e = (conv_errc)((ulong)in_stack_fffffffffffffbf8 >> 0x20);
  paVar4 = &local_99;
  this = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  peVar5 = &local_9a;
  std::allocator<char>::allocator();
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::json_decoder((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                  *)in_stack_fffffffffffffc50._vptr_ser_context,
                 (allocator_type *)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  std::allocator<char>::~allocator((allocator<char> *)&local_9a);
  std::allocator<char>::~allocator(&local_99);
  make_json_visitor_adaptor<jsoncons::basic_json_visitor<char>,jsoncons::json_decoder<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>>
            (in_stack_fffffffffffffbe8);
  visitor = (json_visitor *)&stack0xfffffffffffffc4f;
  options_00 = local_18;
  std::allocator<char>::allocator();
  __fd = (int)local_10;
  basic_msgpack_reader<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  basic_msgpack_reader<std::istream&>
            (this,(basic_istream<char,_std::char_traits<char>_> *)in_RDI,visitor,options_00,
             (allocator<char> *)local_10);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc4f);
  basic_msgpack_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::read
            ((basic_msgpack_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffc50,__fd,__buf,(size_t)options_00);
  bVar1 = json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          ::is_valid(&local_98);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x58);
    std::error_code::error_code<jsoncons::conv_errc,void>(local_10,__e);
    basic_msgpack_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::line
              ((basic_msgpack_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
                *)0x959019);
    basic_msgpack_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::column
              ((basic_msgpack_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
                *)0x95902a);
    ec._M_cat = peVar5;
    ec._0_8_ = paVar4;
    ser_error::ser_error((ser_error *)this,ec,(size_t)in_RDI,(size_t)visitor);
    __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
  }
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::get_result(in_stack_fffffffffffffc48);
  basic_msgpack_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
  ~basic_msgpack_reader(in_stack_fffffffffffffbf0);
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
  ::~json_visitor_adaptor
            ((json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
              *)0x95913b);
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::~json_decoder((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                   *)in_stack_fffffffffffffbf0);
  tVar3.field_0.int64_.val_ = extraout_RDX;
  tVar3.field_0._0_8_ = this;
  return (type)tVar3.field_0;
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value,T>::type 
    decode_msgpack(std::istream& is, 
                   const msgpack_decode_options& options = msgpack_decode_options())
    {
        jsoncons::json_decoder<T> decoder;
        auto adaptor = make_json_visitor_adaptor<json_visitor>(decoder);
        msgpack_stream_reader reader(is, adaptor, options);
        reader.read();
        if (!decoder.is_valid())
        {
            JSONCONS_THROW(ser_error(conv_errc::conversion_failed, reader.line(), reader.column()));
        }
        return decoder.get_result();
    }